

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Butterworth.cpp
# Opt level: O2

void __thiscall
Iir::Butterworth::AnalogLowShelf::design(AnalogLowShelf *this,int numPoles,double gainDb)

{
  double dVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  double dVar4;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  double local_48;
  double dStack_40;
  
  if (this->m_numPoles == numPoles) {
    if ((this->m_gainDb == gainDb) && (!NAN(this->m_gainDb) && !NAN(gainDb))) {
      return;
    }
  }
  this->m_numPoles = numPoles;
  this->m_gainDb = gainDb;
  (this->super_LayoutBase).m_numPoles = 0;
  dVar1 = pow(10.0,gainDb / 20.0);
  dVar1 = pow(dVar1,1.0 / (double)(numPoles * 2));
  local_78 = -1.0 / dVar1;
  dVar4 = -dVar1;
  uStack_70 = 0;
  local_68._8_4_ = extraout_XMM0_Dc;
  local_68._0_8_ = dVar4;
  local_68._12_4_ = extraout_XMM0_Dd ^ 0x80000000;
  local_58._8_4_ = SUB84(dVar1,0);
  local_58._0_8_ = dVar4;
  local_58._12_4_ = (int)((ulong)dVar4 >> 0x20);
  iVar3 = 1;
  local_48 = local_78;
  dStack_40 = local_78;
  for (iVar2 = 1; iVar2 <= numPoles / 2; iVar2 = iVar2 + 1) {
    dVar4 = (0.5 - (double)iVar3 / (double)(numPoles * 2)) * 3.141592653589793;
    dVar1 = cos(dVar4);
    dStack_80 = sin(dVar4);
    local_88 = dVar1 * local_48;
    dStack_80 = dStack_80 * dStack_40;
    dVar1 = cos(dVar4);
    dStack_90 = sin(dVar4);
    local_98 = dVar1 * (double)local_58._0_8_;
    dStack_90 = dStack_90 * (double)local_58._8_8_;
    LayoutBase::addPoleZeroConjugatePairs
              (&this->super_LayoutBase,(complex_t *)&local_88,(complex_t *)&local_98);
    iVar3 = iVar3 + 2;
  }
  if ((numPoles & 1U) != 0) {
    local_88 = local_78;
    dStack_80 = 0.0;
    local_98 = (double)local_68._0_8_;
    dStack_90 = 0.0;
    LayoutBase::add(&this->super_LayoutBase,(complex_t *)&local_88,(complex_t *)&local_98);
  }
  return;
}

Assistant:

void AnalogLowShelf::design (int numPoles, double gainDb)
{
  if (m_numPoles != numPoles ||
      m_gainDb != gainDb)
  {
    m_numPoles = numPoles;
    m_gainDb = gainDb;

    reset ();

    const double n2 = numPoles * 2;
    const double g = pow (pow (10., gainDb/20), 1. / n2);
    const double gp = -1. / g;
    const double gz = -g;

    const int pairs = numPoles / 2;
    for (int i = 1; i <= pairs; ++i)
    {
      const double theta = doublePi * (0.5 - (2 * i - 1) / n2);
      addPoleZeroConjugatePairs (std::polar (gp, theta), std::polar (gz, theta));
    }
    
    if (numPoles & 1)
      add (gp, gz);
  }
}